

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_module * ly_ctx_get_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  byte bVar1;
  LY_ERR *pLVar2;
  lys_module *plVar3;
  ulong uVar4;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
LAB_0010fd1e:
    plVar3 = (lys_module *)0x0;
  }
  else {
    uVar4 = (ulong)*idx;
    do {
      if ((uint)(ctx->models).used <= (uint)uVar4) goto LAB_0010fd1e;
      plVar3 = (ctx->models).list[uVar4];
      uVar4 = uVar4 + 1;
      bVar1 = plVar3->field_0x40;
      *idx = (uint32_t)uVar4;
    } while ((bVar1 & 0x40) != 0);
  }
  return plVar3;
}

Assistant:

lys_module *
ly_ctx_get_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (!ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}